

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::RandomNormalStaticLayerParams::InternalSwap
          (RandomNormalStaticLayerParams *this,RandomNormalStaticLayerParams *other)

{
  RandomNormalStaticLayerParams *other_local;
  RandomNormalStaticLayerParams *this_local;
  
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->outputshape_,&other->outputshape_);
  std::swap<long>(&this->seed_,&other->seed_);
  std::swap<float>(&this->mean_,&other->mean_);
  std::swap<float>(&this->stddev_,&other->stddev_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void RandomNormalStaticLayerParams::InternalSwap(RandomNormalStaticLayerParams* other) {
  outputshape_.InternalSwap(&other->outputshape_);
  std::swap(seed_, other->seed_);
  std::swap(mean_, other->mean_);
  std::swap(stddev_, other->stddev_);
  std::swap(_cached_size_, other->_cached_size_);
}